

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_union_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  flatbuffers_voffset_t fVar1;
  flatbuffers_voffset_t fVar2;
  int iVar3;
  char *pcVar4;
  bool local_71;
  int ret;
  int c_2;
  int c_1;
  int c;
  flatcc_union_verifier_descriptor_t ud;
  flatbuffers_uoffset_t base;
  uint8_t *type;
  flatbuffers_voffset_t vte_table;
  flatbuffers_voffset_t vte_type;
  flatcc_union_verifier_f *uvf_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  fVar1 = read_vt_entry(td,id - 1);
  if (fVar1 == 0) {
    fVar1 = read_vt_entry(td,id);
    if (fVar1 == 0) {
      if (required == 0) {
        td_local._4_4_ = 0;
      }
      else {
        td_local._4_4_ = 0x15;
      }
    }
    else {
      td_local._4_4_ = 0x17;
    }
  }
  else {
    iVar3 = verify_field(td,id - 1,0,1,1);
    if (iVar3 == 0) {
      fVar2 = read_vt_entry(td,id);
      pcVar4 = (char *)((long)td->buf + (long)(int)(uint)fVar1 + (ulong)td->table);
      local_71 = *pcVar4 == '\0' && fVar2 != 0;
      if (local_71) {
        td_local._4_4_ = 0x18;
      }
      else if (*pcVar4 == '\0') {
        td_local._4_4_ = 0;
      }
      else {
        td_local._4_4_ = get_offset_field(td,id,required,(flatbuffers_uoffset_t *)&ud.field_0x1c);
        if ((td_local._4_4_ == 0) && (ud._28_4_ != 0)) {
          _c_1 = td->buf;
          ud.buf._0_4_ = td->end;
          ud.buf._4_4_ = td->ttl;
          ud.ttl = ud._28_4_;
          ud._16_4_ = read_uoffset(td->buf,ud._28_4_);
          ud.end._0_1_ = *pcVar4;
          td_local._4_4_ = (*uvf)((flatcc_union_verifier_descriptor_t *)&c_1);
        }
      }
    }
    else {
      td_local._4_4_ = verify_field(td,id - 1,0,1,1);
    }
  }
  return td_local._4_4_;
}

Assistant:

int flatcc_verify_union_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uint8_t *type;
    uoffset_t base;
    flatcc_union_verifier_descriptor_t ud;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        vte_table = read_vt_entry(td, id);
        verify(vte_table == 0, flatcc_verify_error_union_cannot_have_a_table_without_a_type);
        verify(!required, flatcc_verify_error_type_field_absent_from_required_union_field);
        return flatcc_verify_ok;
    }
    /* No need to check required here. */
    check_result(verify_field(td, id - 1, 0, 1, 1));
    /* Only now is it safe to read the type. */
    vte_table = read_vt_entry(td, id);
    type = (const uint8_t *)td->buf + td->table + vte_type;
    verify(*type || vte_table == 0, flatcc_verify_error_union_type_NONE_cannot_have_a_value);

    if (*type == 0) {
        return flatcc_verify_ok;
    }
    check_field(td, id, required, base);
    ud.buf = td->buf;
    ud.end = td->end;
    ud.ttl = td->ttl;
    ud.base = base;
    ud.offset = read_uoffset(td->buf, base);
    ud.type = *type;
    return uvf(&ud);
}